

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O3

ares_status_t ares_conn_flush(ares_conn_t *conn)

{
  ares_conn_flags_t aVar1;
  ares_status_t aVar2;
  ares_conn_err_t aVar3;
  size_t sVar4;
  uchar *puVar5;
  ares_conn_flags_t aVar6;
  ares_conn_state_flags_t flags;
  unsigned_short msg_len;
  size_t data_len;
  size_t count;
  ushort local_42;
  ulong local_40;
  size_t local_38;
  
  aVar2 = ARES_EFORMERR;
  if (conn != (ares_conn_t *)0x0) {
    aVar1 = conn->flags;
    do {
      sVar4 = ares_buf_len(conn->out_buf);
      aVar6 = conn->flags;
      if (sVar4 == 0) break;
      if ((aVar6 & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
        ares_buf_tag(conn->out_buf);
        aVar2 = ares_buf_fetch_be16(conn->out_buf,&local_42);
        if (aVar2 != ARES_SUCCESS) {
          return aVar2;
        }
        ares_buf_tag_rollback(conn->out_buf);
        puVar5 = ares_buf_peek(conn->out_buf,&local_40);
        if (local_40 < (ulong)local_42 + 2) {
          return ARES_EFORMERR;
        }
        puVar5 = puVar5 + 2;
        local_40 = (ulong)local_42;
      }
      else {
        puVar5 = ares_buf_peek(conn->out_buf,&local_40);
      }
      aVar3 = ares_conn_write(conn,puVar5,local_40,&local_38);
      if (aVar3 != ARES_CONN_ERR_SUCCESS) {
        if (aVar3 != ARES_CONN_ERR_WOULDBLOCK) {
          return ARES_ECONNREFUSED;
        }
        aVar6 = conn->flags;
        break;
      }
      if ((conn->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
        local_38 = local_38 + 2;
      }
      ares_buf_consume(conn->out_buf,local_38);
      aVar6 = conn->flags;
    } while ((aVar6 & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE);
    flags = ((aVar1 & ARES_CONN_FLAG_TFO_INITIAL) >> 1) + ARES_CONN_STATE_READ;
    if (((aVar6 & ARES_CONN_FLAG_TCP) != ARES_CONN_FLAG_NONE) &&
       (sVar4 = ares_buf_len(conn->out_buf), sVar4 != 0)) {
      flags = ARES_CONN_STATE_CBFLAGS;
    }
    ares_conn_sock_state_cb_update(conn,flags);
    aVar2 = ARES_SUCCESS;
  }
  return aVar2;
}

Assistant:

ares_status_t ares_conn_flush(ares_conn_t *conn)
{
  const unsigned char *data;
  size_t               data_len;
  size_t               count;
  ares_conn_err_t      err;
  ares_status_t        status;
  ares_bool_t          tfo = ARES_FALSE;

  if (conn == NULL) {
    return ARES_EFORMERR;
  }

  if (conn->flags & ARES_CONN_FLAG_TFO_INITIAL) {
    tfo = ARES_TRUE;
  }

  do {
    if (ares_buf_len(conn->out_buf) == 0) {
      status = ARES_SUCCESS;
      goto done;
    }

    if (conn->flags & ARES_CONN_FLAG_TCP) {
      data = ares_buf_peek(conn->out_buf, &data_len);
    } else {
      unsigned short msg_len;

      /* Read length, then provide buffer without length */
      ares_buf_tag(conn->out_buf);
      status = ares_buf_fetch_be16(conn->out_buf, &msg_len);
      if (status != ARES_SUCCESS) {
        return status;
      }
      ares_buf_tag_rollback(conn->out_buf);

      data = ares_buf_peek(conn->out_buf, &data_len);
      if (data_len < (size_t)(msg_len + 2)) {
        status = ARES_EFORMERR;
        goto done;
      }
      data     += 2;
      data_len  = msg_len;
    }

    err = ares_conn_write(conn, data, data_len, &count);
    if (err != ARES_CONN_ERR_SUCCESS) {
      if (err != ARES_CONN_ERR_WOULDBLOCK) {
        status = ARES_ECONNREFUSED;
        goto done;
      }
      status = ARES_SUCCESS;
      goto done;
    }

    /* UDP didn't send the length prefix so augment that here */
    if (!(conn->flags & ARES_CONN_FLAG_TCP)) {
      count += 2;
    }

    /* Strip data written from the buffer */
    ares_buf_consume(conn->out_buf, count);
    status = ARES_SUCCESS;

    /* Loop only for UDP since we have to send per-packet.  We already
     * sent everything we could if using tcp */
  } while (!(conn->flags & ARES_CONN_FLAG_TCP));

done:
  if (status == ARES_SUCCESS) {
    ares_conn_state_flags_t flags = ARES_CONN_STATE_READ;

    /* When using TFO, the we need to enabling waiting on a write event to
     * be notified of when a connection is actually established */
    if (tfo) {
      flags |= ARES_CONN_STATE_WRITE;
    }

    /* If using TCP and not all data was written (partial write), that means
     * we need to also wait on a write event */
    if (conn->flags & ARES_CONN_FLAG_TCP && ares_buf_len(conn->out_buf)) {
      flags |= ARES_CONN_STATE_WRITE;
    }

    ares_conn_sock_state_cb_update(conn, flags);
  }

  return status;
}